

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  bool bVar5;
  int local_48;
  undefined2 local_44;
  short local_42;
  nn_pollfd pfd [2];
  undefined1 local_30 [8];
  nn_thread thread;
  char buf [3];
  int sb;
  int rc;
  
  thread.handle._4_4_ =
       test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                        ,0x83,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0x84,thread.handle._4_4_,"inproc://a");
  sc = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                        ,0x85,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                    ,0x86,sc,"inproc://a");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0x87,sc,"ABC");
  nn_sleep(100);
  local_48 = thread.handle._4_4_;
  local_44 = 3;
  pfd[0].fd = sc;
  pfd[0].events = 3;
  iVar1 = nn_poll(&local_48,2,0xffffffff);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x8e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (iVar1 != 2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 2",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x8f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (local_42 != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pfd [0].revents == (NN_POLLIN | NN_POLLOUT)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x90);
    fflush(_stderr);
    nn_err_abort();
  }
  if (pfd[0].revents != 2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pfd [1].revents == NN_POLLOUT",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x91);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                  ,0x92,sc);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                  ,0x93,thread.handle._4_4_);
  thread.handle._4_4_ =
       test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                        ,0x96,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0x97,thread.handle._4_4_,"inproc://a");
  sc = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                        ,0x98,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                    ,0x99,sc,"inproc://a");
  iVar1 = getevents(thread.handle._4_4_,3,1000);
  if (iVar1 != 2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == NN_OUT",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x9d);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = getevents(thread.handle._4_4_,1,10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xa2);
    fflush(_stderr);
    nn_err_abort();
  }
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0xa6,sc,"ABC");
  iVar1 = getevents(thread.handle._4_4_,1,1000);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == NN_IN",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xa8);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0xab,thread.handle._4_4_,"ABC");
  iVar1 = getevents(thread.handle._4_4_,1,10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xad);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_thread_init((nn_thread *)local_30,routine1,(void *)0x0);
  iVar1 = getevents(thread.handle._4_4_,1,1000);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == NN_IN",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xb2);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                 ,0xb3,thread.handle._4_4_,"ABC");
  nn_thread_term((nn_thread *)local_30);
  nn_thread_init((nn_thread *)local_30,routine2,(void *)0x0);
  iVar1 = getevents(thread.handle._4_4_,1,1000);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == NN_IN",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xb9);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_recv(thread.handle._4_4_,(undefined1 *)((long)&thread.handle + 1),3,0);
  bVar5 = false;
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    bVar5 = iVar1 == 0x9523dfd;
  }
  if (!bVar5) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0xbb);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_thread_term((nn_thread *)local_30);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                  ,0xbf,sc);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c"
                  ,0xc0,thread.handle._4_4_);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int sb;
    char buf [3];
    struct nn_thread thread;
    struct nn_pollfd pfd [2];

    /* Test nn_poll() function. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_send (sc, "ABC");
    nn_sleep (100);
    pfd [0].fd = sb;
    pfd [0].events = NN_POLLIN | NN_POLLOUT;
    pfd [1].fd = sc;
    pfd [1].events = NN_POLLIN | NN_POLLOUT;
    rc = nn_poll (pfd, 2, -1);
    errno_assert (rc >= 0);
    nn_assert (rc == 2);
    nn_assert (pfd [0].revents == (NN_POLLIN | NN_POLLOUT));
    nn_assert (pfd [1].revents == NN_POLLOUT);
    test_close (sc);
    test_close (sb);

    /*  Create a simple topology. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Check the initial state of the socket. */
    rc = getevents (sb, NN_IN | NN_OUT, 1000);
    nn_assert (rc == NN_OUT);

    /*  Poll for IN when there's no message available. The call should
        time out. */
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Send a message and start polling. This time IN event should be
        signaled. */
    test_send (sc, "ABC");
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);

    /*  Receive the message and make sure that IN is no longer signaled. */
    test_recv (sb, "ABC");
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Check signalling from a different thread. */
    nn_thread_init (&thread, routine1, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    test_recv (sb, "ABC");
    nn_thread_term (&thread);

    /*  Check terminating the library from a different thread. */
    nn_thread_init (&thread, routine2, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    nn_assert (rc < 0 && nn_errno () == ETERM);
    nn_thread_term (&thread);

    /*  Clean up. */
    test_close (sc);
    test_close (sb);

    return 0;
}